

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_data_source_set_range_in_pcm_frames
                    (ma_data_source *pDataSource,ma_uint64 rangeBegInFrames,
                    ma_uint64 rangeEndInFrames)

{
  ma_result mVar1;
  ulong frameIndex;
  ulong in_RDX;
  ulong in_RSI;
  ma_data_source *in_RDI;
  ma_bool32 doSeekAdjustment;
  ma_uint64 absoluteCursor;
  ma_uint64 relativeCursor;
  ma_result result;
  ma_data_source_base *pDataSourceBase;
  ma_data_source *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 local_4;
  
  if (in_RDI == (ma_data_source *)0x0) {
    local_4 = MA_INVALID_ARGS;
  }
  else if (in_RDX < in_RSI) {
    local_4 = MA_INVALID_ARGS;
  }
  else {
    mVar1 = ma_data_source_get_cursor_in_pcm_frames
                      (in_RDI,(ma_uint64 *)
                              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    if (mVar1 != MA_SUCCESS) {
      in_stack_ffffffffffffffc8 = (ma_data_source *)0x0;
      frameIndex = 0;
    }
    else {
      frameIndex = (long)in_stack_ffffffffffffffc8 + *(long *)((long)in_RDI + 8);
    }
    *(ulong *)((long)in_RDI + 8) = in_RSI;
    *(ulong *)((long)in_RDI + 0x10) = in_RDX;
    *(undefined8 *)((long)in_RDI + 0x18) = 0;
    *(undefined8 *)((long)in_RDI + 0x20) = 0xffffffffffffffff;
    if (mVar1 == MA_SUCCESS) {
      if (frameIndex < in_RSI) {
        ma_data_source_seek_to_pcm_frame(in_stack_ffffffffffffffc8,frameIndex);
      }
      else if (in_RDX < frameIndex) {
        ma_data_source_seek_to_pcm_frame(in_stack_ffffffffffffffc8,frameIndex);
      }
    }
    local_4 = MA_SUCCESS;
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_data_source_set_range_in_pcm_frames(ma_data_source* pDataSource, ma_uint64 rangeBegInFrames, ma_uint64 rangeEndInFrames)
{
    ma_data_source_base* pDataSourceBase = (ma_data_source_base*)pDataSource;
    ma_result result;
    ma_uint64 relativeCursor;
    ma_uint64 absoluteCursor;
    ma_bool32 doSeekAdjustment = MA_FALSE;

    if (pDataSource == NULL) {
        return MA_INVALID_ARGS;
    }

    if (rangeEndInFrames < rangeBegInFrames) {
        return MA_INVALID_ARGS; /* The end of the range must come after the beginning. */
    }

    /*
    We may need to adjust the position of the cursor to ensure it's clamped to the range. Grab it now
    so we can calculate its absolute position before we change the range.
    */
    result = ma_data_source_get_cursor_in_pcm_frames(pDataSource, &relativeCursor);
    if (result == MA_SUCCESS) {
        doSeekAdjustment = MA_TRUE;
        absoluteCursor = relativeCursor + pDataSourceBase->rangeBegInFrames;
    } else {
        /*
        We couldn't get the position of the cursor. It probably means the data source has no notion
        of a cursor. We'll just leave it at position 0. Don't treat this as an error.
        */
        doSeekAdjustment = MA_FALSE;
        relativeCursor = 0;
        absoluteCursor = 0;
    }

    pDataSourceBase->rangeBegInFrames = rangeBegInFrames;
    pDataSourceBase->rangeEndInFrames = rangeEndInFrames;

    /*
    The commented out logic below was intended to maintain loop points in response to a change in the
    range. However, this is not useful because it results in the sound breaking when you move the range
    outside of the old loop points. I'm simplifying this by simply resetting the loop points. The
    caller is expected to update their loop points if they change the range.

    In practice this should be mostly a non-issue because the majority of the time the range will be
    set once right after initialization.
    */
    pDataSourceBase->loopBegInFrames = 0;
    pDataSourceBase->loopEndInFrames = ~((ma_uint64)0);


    /*
    Seek to within range. Note that our seek positions here are relative to the new range. We don't want
    to do this if we failed to retrieve the cursor earlier on because it probably means the data source
    has no notion of a cursor. In practice the seek would probably fail (which we silently ignore), but
    I'm just not even going to attempt it.
    */
    if (doSeekAdjustment) {
        if (absoluteCursor < rangeBegInFrames) {
            ma_data_source_seek_to_pcm_frame(pDataSource, 0);
        } else if (absoluteCursor > rangeEndInFrames) {
            ma_data_source_seek_to_pcm_frame(pDataSource, rangeEndInFrames - rangeBegInFrames);
        }
    }

    return MA_SUCCESS;
}